

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

void __thiscall
gl4cts::EnhancedLayouts::Utils::Program::GetResource
          (Program *this,GLenum interface,GLuint index,GLenum property,GLsizei buf_size,
          GLint *params)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  GetResource((Functions *)CONCAT44(extraout_var,iVar1),this->m_id,interface,index,property,buf_size
              ,params);
  return;
}

Assistant:

void Program::GetResource(GLenum interface, GLuint index, GLenum property, GLsizei buf_size, GLint* params) const
{
	const Functions& gl = m_context.getRenderContext().getFunctions();

	GetResource(gl, m_id, interface, index, property, buf_size, params);
}